

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.hpp
# Opt level: O0

bool __thiscall helics::NamedPoint::operator==(NamedPoint *this,NamedPoint *np)

{
  pointer pcVar1;
  uint uVar2;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  __type_conflict local_1a;
  __type_conflict local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  __rhs = in_RDI;
  uVar2 = std::isnan((double)in_RDI[1]._M_dataplus._M_p);
  if (((uVar2 & 1) == 0) || (uVar2 = std::isnan(*(double *)(in_RSI + 0x20)), (uVar2 & 1) == 0)) {
    pcVar1 = in_RDI[1]._M_dataplus._M_p;
    local_1a = false;
    if (((double)pcVar1 == *(double *)(in_RSI + 0x20)) &&
       (!NAN((double)pcVar1) && !NAN(*(double *)(in_RSI + 0x20)))) {
      local_1a = std::operator==(unaff_retaddr,__rhs);
    }
    local_19 = local_1a;
  }
  else {
    local_19 = std::operator==(unaff_retaddr,__rhs);
  }
  return local_19;
}

Assistant:

bool operator==(const NamedPoint& np) const
    {
        return ((std::isnan(value)) && (std::isnan(np.value))) ?
            (name == np.name) :
            ((value == np.value) && (name == np.name));
    }